

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O1

statement * copy_one_statement(dmr_C *C,statement *stmt)

{
  statement_type type;
  undefined4 uVar1;
  expression *peVar2;
  statement *psVar3;
  symbol *psVar4;
  symbol_list *psVar5;
  symbol *psVar6;
  statement *psVar7;
  ptr_list **listp;
  expression_list *peVar8;
  statement *psVar9;
  long lVar10;
  statement *psVar11;
  byte bVar12;
  undefined1 local_60 [8];
  ptr_list_iter symiter__;
  
  bVar12 = 0;
  if (stmt == (statement *)0x0) {
    return (statement *)0x0;
  }
  type = stmt->type;
  psVar3 = stmt;
  switch(type) {
  case STMT_NONE:
    break;
  case STMT_DECLARATION:
    symiter__._16_8_ = dmrC_alloc_statement(C,stmt->pos,type);
    psVar9 = (statement *)symiter__._16_8_;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      uVar1 = *(undefined4 *)&(psVar3->pos).field_0x0;
      psVar9->type = psVar3->type;
      *(undefined4 *)&(psVar9->pos).field_0x0 = uVar1;
      psVar3 = (statement *)((long)psVar3 + (ulong)bVar12 * -0x10 + 8);
      psVar9 = (statement *)((long)psVar9 + (ulong)bVar12 * -0x10 + 8);
    }
    (((statement *)symiter__._16_8_)->field_2).field_1.expression = (expression *)0x0;
    ptrlist_forward_iterator
              ((ptr_list_iter *)local_60,(ptr_list *)(stmt->field_2).field_1.expression);
    psVar4 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_60);
    psVar3 = (statement *)symiter__._16_8_;
    if (psVar4 != (symbol *)0x0) {
      listp = (ptr_list **)(symiter__._16_8_ + 0x10);
      do {
        psVar6 = copy_symbol(C,stmt->pos,psVar4);
        if (psVar6 != psVar4) {
          peVar2 = copy_expression(C,(psVar4->field_14).field_2.initializer);
          (psVar6->field_14).field_2.initializer = peVar2;
        }
        ptrlist_add(listp,psVar6,&C->ptrlist_allocator);
        psVar4 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_60);
        psVar3 = (statement *)symiter__._16_8_;
      } while (psVar4 != (symbol *)0x0);
    }
    break;
  case STMT_EXPRESSION:
  case STMT_CONTEXT:
  case STMT_RANGE:
    peVar2 = copy_expression(C,(stmt->field_2).field_1.expression);
    if (peVar2 != (stmt->field_2).field_1.expression) {
      psVar3 = dmrC_alloc_statement(C,stmt->pos,stmt->type);
      psVar9 = psVar3;
      for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
        uVar1 = *(undefined4 *)&(stmt->pos).field_0x0;
        psVar9->type = stmt->type;
        *(undefined4 *)&(psVar9->pos).field_0x0 = uVar1;
        stmt = (statement *)((long)stmt + (ulong)bVar12 * -0x10 + 8);
        psVar9 = (statement *)((long)psVar9 + (ulong)bVar12 * -0x10 + 8);
      }
      (psVar3->field_2).field_1.expression = peVar2;
    }
    break;
  case STMT_COMPOUND:
    psVar3 = dmrC_alloc_statement(C,stmt->pos,3);
    dmrC_copy_statement(C,stmt,psVar3);
    break;
  case STMT_IF:
    psVar9 = (stmt->field_2).field_3.if_true;
    psVar7 = (stmt->field_2).field_3.if_false;
    peVar2 = copy_expression(C,(stmt->field_2).field_1.expression);
    psVar9 = copy_one_statement(C,psVar9);
    psVar7 = copy_one_statement(C,psVar7);
    if ((((stmt->field_2).field_1.expression != peVar2) ||
        ((statement *)(stmt->field_2).field_1.context != psVar9)) ||
       ((stmt->field_2).field_3.if_false != psVar7)) {
      psVar3 = dmrC_alloc_statement(C,stmt->pos,stmt->type);
      psVar11 = psVar3;
      for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
        uVar1 = *(undefined4 *)&(stmt->pos).field_0x0;
        psVar11->type = stmt->type;
        *(undefined4 *)&(psVar11->pos).field_0x0 = uVar1;
        stmt = (statement *)((long)stmt + (ulong)bVar12 * -0x10 + 8);
        psVar11 = (statement *)((long)psVar11 + (ulong)bVar12 * -0x10 + 8);
      }
      (psVar3->field_2).field_1.expression = peVar2;
      (psVar3->field_2).field_3.if_true = psVar9;
      (psVar3->field_2).field_3.if_false = psVar7;
    }
    break;
  case STMT_RETURN:
    peVar2 = copy_expression(C,(stmt->field_2).field_1.expression);
    psVar4 = copy_symbol(C,stmt->pos,(stmt->field_2).field_2.ret_target);
    psVar3 = dmrC_alloc_statement(C,stmt->pos,stmt->type);
    psVar9 = psVar3;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      uVar1 = *(undefined4 *)&(stmt->pos).field_0x0;
      psVar9->type = stmt->type;
      *(undefined4 *)&(psVar9->pos).field_0x0 = uVar1;
      stmt = (statement *)((long)stmt + (ulong)bVar12 * -0x10 + 8);
      psVar9 = (statement *)((long)psVar9 + (ulong)bVar12 * -0x10 + 8);
    }
    (psVar3->field_2).field_1.expression = peVar2;
    (psVar3->field_2).field_2.ret_target = psVar4;
    break;
  case STMT_CASE:
    psVar3 = dmrC_alloc_statement(C,stmt->pos,type);
    psVar9 = psVar3;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      uVar1 = *(undefined4 *)&(stmt->pos).field_0x0;
      psVar9->type = stmt->type;
      *(undefined4 *)&(psVar9->pos).field_0x0 = uVar1;
      stmt = (statement *)((long)stmt + (ulong)bVar12 * -0x10 + 8);
      psVar9 = (statement *)((long)psVar9 + (ulong)bVar12 * -0x10 + 8);
    }
    psVar4 = copy_symbol(C,psVar3->pos,(psVar3->field_2).field_6.case_label);
    (psVar3->field_2).field_6.case_label = psVar4;
    (psVar4->field_14).field_2.stmt = psVar3;
    peVar2 = copy_expression(C,(psVar3->field_2).field_1.expression);
    (psVar3->field_2).field_1.expression = peVar2;
    peVar2 = copy_expression(C,(psVar3->field_2).field_1.context);
    (psVar3->field_2).field_1.context = peVar2;
    psVar5 = (symbol_list *)copy_one_statement(C,(psVar3->field_2).field_3.if_false);
    goto LAB_00113514;
  case STMT_SWITCH:
    psVar4 = copy_symbol(C,stmt->pos,(stmt->field_2).field_4.inline_fn);
    psVar6 = copy_symbol(C,stmt->pos,(stmt->field_2).field_6.case_label);
    peVar2 = copy_expression(C,(stmt->field_2).field_1.expression);
    psVar7 = copy_one_statement(C,(stmt->field_2).field_3.if_true);
    psVar3 = dmrC_alloc_statement(C,stmt->pos,stmt->type);
    psVar9 = psVar3;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      uVar1 = *(undefined4 *)&(stmt->pos).field_0x0;
      psVar9->type = stmt->type;
      *(undefined4 *)&(psVar9->pos).field_0x0 = uVar1;
      stmt = (statement *)((long)stmt + (ulong)bVar12 * -0x10 + 8);
      psVar9 = (statement *)((long)psVar9 + (ulong)bVar12 * -0x10 + 8);
    }
    psVar5 = copy_symbol_list(C,(psVar6->field_14).field_2.symbol_list);
    (psVar6->field_14).field_2.symbol_list = psVar5;
    (psVar3->field_2).field_4.inline_fn = psVar4;
    (psVar3->field_2).field_6.case_label = psVar6;
    (psVar3->field_2).field_1.expression = peVar2;
    (psVar3->field_2).field_3.if_true = psVar7;
    break;
  case STMT_ITERATOR:
    psVar3 = dmrC_alloc_statement(C,stmt->pos,type);
    psVar9 = psVar3;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      uVar1 = *(undefined4 *)&(stmt->pos).field_0x0;
      psVar9->type = stmt->type;
      *(undefined4 *)&(psVar9->pos).field_0x0 = uVar1;
      stmt = (statement *)((long)stmt + (ulong)bVar12 * -0x10 + 8);
      psVar9 = (statement *)((long)psVar9 + (ulong)bVar12 * -0x10 + 8);
    }
    psVar4 = copy_symbol(C,psVar3->pos,(psVar3->field_2).field_5.label_identifier);
    (psVar3->field_2).field_5.label_identifier = psVar4;
    psVar4 = copy_symbol(C,psVar3->pos,(psVar3->field_2).field_2.ret_target);
    (psVar3->field_2).field_2.ret_target = psVar4;
    psVar5 = copy_symbol_list(C,(psVar3->field_2).field_8.iterator_syms);
    (psVar3->field_2).field_8.iterator_syms = psVar5;
    psVar9 = copy_one_statement(C,(psVar3->field_2).field_4.args);
    (psVar3->field_2).field_4.args = psVar9;
    peVar2 = copy_expression(C,(psVar3->field_2).field_8.iterator_pre_condition);
    (psVar3->field_2).field_8.iterator_pre_condition = peVar2;
    psVar9 = copy_one_statement(C,(psVar3->field_2).field_8.iterator_statement);
    (psVar3->field_2).field_8.iterator_statement = psVar9;
    psVar9 = copy_one_statement(C,(psVar3->field_2).field_8.iterator_post_statement);
    (psVar3->field_2).field_8.iterator_post_statement = psVar9;
    peVar2 = copy_expression(C,(psVar3->field_2).field_8.iterator_post_condition);
    (psVar3->field_2).field_8.iterator_post_condition = peVar2;
    break;
  case STMT_LABEL:
    psVar3 = dmrC_alloc_statement(C,stmt->pos,type);
    psVar9 = psVar3;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      uVar1 = *(undefined4 *)&(stmt->pos).field_0x0;
      psVar9->type = stmt->type;
      *(undefined4 *)&(psVar9->pos).field_0x0 = uVar1;
      stmt = (statement *)((long)stmt + (ulong)bVar12 * -0x10 + 8);
      psVar9 = (statement *)((long)psVar9 + (ulong)bVar12 * -0x10 + 8);
    }
    psVar4 = copy_symbol(C,psVar3->pos,(psVar3->field_2).field_5.label_identifier);
    (psVar3->field_2).field_5.label_identifier = psVar4;
    peVar8 = (expression_list *)copy_one_statement(C,(psVar3->field_2).field_3.if_true);
    goto LAB_0011337e;
  case STMT_GOTO:
    psVar3 = dmrC_alloc_statement(C,stmt->pos,type);
    psVar9 = psVar3;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      uVar1 = *(undefined4 *)&(stmt->pos).field_0x0;
      psVar9->type = stmt->type;
      *(undefined4 *)&(psVar9->pos).field_0x0 = uVar1;
      stmt = (statement *)((long)stmt + (ulong)bVar12 * -0x10 + 8);
      psVar9 = (statement *)((long)psVar9 + (ulong)bVar12 * -0x10 + 8);
    }
    psVar4 = copy_symbol(C,psVar3->pos,(psVar3->field_2).field_5.label_identifier);
    (psVar3->field_2).field_5.label_identifier = psVar4;
    peVar2 = copy_expression(C,(psVar3->field_2).field_1.context);
    (psVar3->field_2).field_1.context = peVar2;
    psVar5 = copy_symbol_list(C,(psVar3->field_2).field_8.iterator_syms);
LAB_00113514:
    (psVar3->field_2).field_8.iterator_syms = psVar5;
    break;
  case STMT_ASM:
    psVar3 = dmrC_alloc_statement(C,stmt->pos,type);
    psVar9 = psVar3;
    for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
      uVar1 = *(undefined4 *)&(stmt->pos).field_0x0;
      psVar9->type = stmt->type;
      *(undefined4 *)&(psVar9->pos).field_0x0 = uVar1;
      stmt = (statement *)((long)stmt + (ulong)bVar12 * -0x10 + 8);
      psVar9 = (statement *)((long)psVar9 + (ulong)bVar12 * -0x10 + 8);
    }
    peVar8 = copy_asm_constraints(C,(psVar3->field_2).field_10.asm_inputs);
    (psVar3->field_2).field_10.asm_inputs = peVar8;
    peVar8 = copy_asm_constraints(C,(psVar3->field_2).field_10.asm_outputs);
LAB_0011337e:
    (psVar3->field_2).field_10.asm_outputs = peVar8;
    break;
  default:
    dmrC_warning(C,stmt->pos,"trying to copy statement type %d");
  }
  return psVar3;
}

Assistant:

static struct statement *copy_one_statement(struct dmr_C *C, struct statement *stmt)
{
	if (!stmt)
		return NULL;
	switch(stmt->type) {
	case STMT_NONE:
		break;
	case STMT_DECLARATION: {
		struct symbol *sym;
		struct statement *newstmt = dup_statement(C, stmt);
		newstmt->declaration = NULL;
		FOR_EACH_PTR(stmt->declaration, sym) {
			struct symbol *newsym = copy_symbol(C, stmt->pos, sym);
			if (newsym != sym)
				newsym->initializer = copy_expression(C, sym->initializer);
			dmrC_add_symbol(C, &newstmt->declaration, newsym);
		} END_FOR_EACH_PTR(sym);
		stmt = newstmt;
		break;
	}
	case STMT_CONTEXT:
	case STMT_EXPRESSION: {
		struct expression *expr = copy_expression(C, stmt->expression);
		if (expr == stmt->expression)
			break;
		stmt = dup_statement(C, stmt);
		stmt->expression = expr;
		break;
	}
	case STMT_RANGE: {
		struct expression *expr = copy_expression(C, stmt->range_expression);
		if (expr == stmt->expression)
			break;
		stmt = dup_statement(C, stmt);
		stmt->range_expression = expr;
		break;
	}
	case STMT_COMPOUND: {
		struct statement *newst = dmrC_alloc_statement(C, stmt->pos, STMT_COMPOUND);
		dmrC_copy_statement(C, stmt, newst);
		stmt = newst;
		break;
	}
	case STMT_IF: {
		struct expression *cond = stmt->if_conditional;
		struct statement *trues = stmt->if_true;
		struct statement *falses = stmt->if_false;

		cond = copy_expression(C, cond);
		trues = copy_one_statement(C, trues);
		falses = copy_one_statement(C, falses);
		if (stmt->if_conditional == cond &&
		    stmt->if_true == trues &&
		    stmt->if_false == falses)
			break;
		stmt = dup_statement(C, stmt);
		stmt->if_conditional = cond;
		stmt->if_true = trues;
		stmt->if_false = falses;
		break;
	}
	case STMT_RETURN: {
		struct expression *retval = copy_expression(C, stmt->ret_value);
		struct symbol *sym = copy_symbol(C, stmt->pos, stmt->ret_target);

		stmt = dup_statement(C, stmt);
		stmt->ret_value = retval;
		stmt->ret_target = sym;
		break;
	}
	case STMT_CASE: {
		stmt = dup_statement(C, stmt);
		stmt->case_label = copy_symbol(C, stmt->pos, stmt->case_label);
		stmt->case_label->stmt = stmt;
		stmt->case_expression = copy_expression(C, stmt->case_expression);
		stmt->case_to = copy_expression(C, stmt->case_to);
		stmt->case_statement = copy_one_statement(C, stmt->case_statement);
		break;
	}
	case STMT_SWITCH: {
		struct symbol *switch_break = copy_symbol(C, stmt->pos, stmt->switch_break);
		struct symbol *switch_case = copy_symbol(C, stmt->pos, stmt->switch_case);
		struct expression *expr = copy_expression(C, stmt->switch_expression);
		struct statement *switch_stmt = copy_one_statement(C, stmt->switch_statement);

		stmt = dup_statement(C, stmt);
		switch_case->symbol_list = copy_symbol_list(C, switch_case->symbol_list);
		stmt->switch_break = switch_break;
		stmt->switch_case = switch_case;
		stmt->switch_expression = expr;
		stmt->switch_statement = switch_stmt;
		break;		
	}
	case STMT_ITERATOR: {
		stmt = dup_statement(C, stmt);
		stmt->iterator_break = copy_symbol(C, stmt->pos, stmt->iterator_break);
		stmt->iterator_continue = copy_symbol(C, stmt->pos, stmt->iterator_continue);
		stmt->iterator_syms = copy_symbol_list(C, stmt->iterator_syms);

		stmt->iterator_pre_statement = copy_one_statement(C, stmt->iterator_pre_statement);
		stmt->iterator_pre_condition = copy_expression(C, stmt->iterator_pre_condition);

		stmt->iterator_statement = copy_one_statement(C, stmt->iterator_statement);

		stmt->iterator_post_statement = copy_one_statement(C, stmt->iterator_post_statement);
		stmt->iterator_post_condition = copy_expression(C, stmt->iterator_post_condition);
		break;
	}
	case STMT_LABEL: {
		stmt = dup_statement(C, stmt);
		stmt->label_identifier = copy_symbol(C, stmt->pos, stmt->label_identifier);
		stmt->label_statement = copy_one_statement(C, stmt->label_statement);
		break;
	}
	case STMT_GOTO: {
		stmt = dup_statement(C, stmt);
		stmt->goto_label = copy_symbol(C, stmt->pos, stmt->goto_label);
		stmt->goto_expression = copy_expression(C, stmt->goto_expression);
		stmt->target_list = copy_symbol_list(C, stmt->target_list);
		break;
	}
	case STMT_ASM: {
		stmt = dup_statement(C, stmt);
		stmt->asm_inputs = copy_asm_constraints(C, stmt->asm_inputs);
		stmt->asm_outputs = copy_asm_constraints(C, stmt->asm_outputs);
		/* no need to dup "clobbers", since they are all constant strings */
		break;
	}
	default:
		dmrC_warning(C, stmt->pos, "trying to copy statement type %d", stmt->type);
		break;
	}
	return stmt;
}